

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_test(stbi__context *s)

{
  int iVar1;
  
  iVar1 = stbi__hdr_test_core(s,"#?RADIANCE\n");
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = stbi__hdr_test_core(s,"#?RGBE\n");
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return iVar1;
}

Assistant:

static int stbi__hdr_test(stbi__context *s)
{
    int r = stbi__hdr_test_core(s, "#?RADIANCE\n");
    stbi__rewind(s);
    if (!r)
    {
        r = stbi__hdr_test_core(s, "#?RGBE\n");
        stbi__rewind(s);
    }
    return r;
}